

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O2

void __thiscall
QRenderRule::drawBackgroundImage(QRenderRule *this,QPainter *p,QRect *rect,QPoint off)

{
  Repeat RVar1;
  bool bVar2;
  char cVar3;
  QStyleSheetBackgroundData *pQVar4;
  undefined8 uVar5;
  QSize QVar6;
  Representation y;
  Representation x;
  Representation RVar7;
  Representation RVar8;
  int iVar9;
  int iVar10;
  QPixmap *pm;
  Representation RVar11;
  int iVar12;
  Representation RVar13;
  int iVar14;
  long in_FS_OFFSET;
  qreal c;
  undefined1 auVar15 [16];
  QPoint local_78;
  QRect local_70;
  QRect local_60;
  QSize local_50;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = hasBackground(this);
  if (!bVar2) goto LAB_00340b08;
  pm = &((this->bg).d.ptr)->pixmap;
  cVar3 = QPixmap::isNull();
  if (cVar3 != '\0') goto LAB_00340b08;
  local_48 = borderRect(this,rect);
  setClip(this,p,&local_48);
  pQVar4 = (this->bg).d.ptr;
  if (pQVar4->origin != pQVar4->clip) {
    QPainter::save();
    local_48 = originRect(this,rect,((this->bg).d.ptr)->clip);
    QPainter::setClipRect((QRect *)p,(ClipOperation)&local_48);
    pQVar4 = (this->bg).d.ptr;
  }
  bVar2 = pQVar4->attachment == Attachment_Fixed;
  RVar13 = off.xp.m_i;
  if (bVar2) {
    RVar13.m_i = 0;
  }
  RVar11 = off.yp.m_i;
  if (bVar2) {
    RVar11.m_i = 0;
  }
  uVar5 = QPixmap::size();
  local_48.x1.m_i = (int)uVar5;
  local_48.y1.m_i = (int)((ulong)uVar5 >> 0x20);
  c = (qreal)QPixmap::devicePixelRatio();
  QVar6 = operator/((QSize *)&local_48,c);
  local_50 = QVar6;
  local_48 = originRect(this,rect,((this->bg).d.ptr)->origin);
  local_60 = QStyle::alignedRect(LeftToRight,
                                 (Alignment)
                                 (((this->bg).d.ptr)->position).
                                 super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                                 super_QFlagsStorage<Qt::AlignmentFlag>.i,&local_50,&local_48);
  local_78.xp.m_i = -RVar13.m_i;
  local_78.yp.m_i = -RVar11.m_i;
  local_70 = QRect::translated(&local_60,&local_78);
  auVar15 = QRect::operator&(&local_70,&local_48);
  RVar1 = ((this->bg).d.ptr)->repeat;
  y.m_i = auVar15._4_4_;
  RVar8 = QVar6.wd.m_i;
  if (RVar1 == Repeat_X) {
    iVar10 = local_48.x2.m_i - local_48.x1.m_i;
    iVar9 = auVar15._12_4_ - y.m_i;
    iVar14 = (RVar13.m_i + RVar8.m_i) - (local_60.x1.m_i - local_48.x1.m_i) % RVar8.m_i;
    iVar12 = (RVar11.m_i + y.m_i) - local_60.y1.m_i;
    x.m_i = local_48.x1.m_i;
LAB_00340a8d:
    QPainter::drawTiledPixmap(p,x.m_i,y.m_i,iVar10 + 1,iVar9 + 1,pm,iVar14,iVar12);
  }
  else {
    RVar7 = QVar6.ht.m_i;
    if (RVar1 == Repeat_XY) {
      local_70.y1.m_i = (RVar11.m_i + RVar7.m_i) - (local_60.y1.m_i - local_48.y1.m_i) % RVar7.m_i;
      local_70.x1.m_i = (RVar13.m_i + RVar8.m_i) - (local_60.x1.m_i - local_48.x1.m_i) % RVar8.m_i;
      QPainter::drawTiledPixmap(p,&local_48,pm,(QPoint *)&local_70);
    }
    else {
      x.m_i = auVar15._0_4_;
      if (RVar1 == Repeat_Y) {
        iVar10 = auVar15._8_4_ - x.m_i;
        iVar9 = local_48.y2.m_i - local_48.y1.m_i;
        iVar14 = (RVar13.m_i + x.m_i) - local_60.x1.m_i;
        iVar12 = (RVar11.m_i + RVar7.m_i) - (local_60.y1.m_i - local_48.y1.m_i) % RVar7.m_i;
        y.m_i = local_48.y1.m_i;
        goto LAB_00340a8d;
      }
      iVar14 = (RVar13.m_i + x.m_i) - local_60.x1.m_i;
      iVar12 = (RVar11.m_i + y.m_i) - local_60.y1.m_i;
      iVar9 = QPixmap::width();
      iVar10 = QPixmap::height();
      QPainter::drawPixmap(p,x.m_i,y.m_i,pm,iVar14,iVar12,iVar9,iVar10);
    }
  }
  pQVar4 = (this->bg).d.ptr;
  if (pQVar4->origin != pQVar4->clip) {
    QPainter::restore();
  }
  unsetClip(this,p);
LAB_00340b08:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QRenderRule::drawBackgroundImage(QPainter *p, const QRect &rect, QPoint off)
{
    if (!hasBackground())
        return;

    const QPixmap& bgp = background()->pixmap;
    if (bgp.isNull())
        return;

    setClip(p, borderRect(rect));

    if (background()->origin != background()->clip) {
        p->save();
        p->setClipRect(originRect(rect, background()->clip), Qt::IntersectClip);
    }

    if (background()->attachment == Attachment_Fixed)
        off = QPoint(0, 0);

    QSize bgpSize = bgp.size() / bgp.devicePixelRatio();
    int bgpHeight = bgpSize.height();
    int bgpWidth = bgpSize.width();
    QRect r = originRect(rect, background()->origin);
    QRect aligned = QStyle::alignedRect(Qt::LeftToRight, background()->position, bgpSize, r);
    QRect inter = aligned.translated(-off).intersected(r);

    switch (background()->repeat) {
    case Repeat_Y:
        p->drawTiledPixmap(inter.x(), r.y(), inter.width(), r.height(), bgp,
                           inter.x() - aligned.x() + off.x(),
                           bgpHeight - int(aligned.y() - r.y()) % bgpHeight + off.y());
        break;
    case Repeat_X:
        p->drawTiledPixmap(r.x(), inter.y(), r.width(), inter.height(), bgp,
                           bgpWidth - int(aligned.x() - r.x())%bgpWidth + off.x(),
                           inter.y() - aligned.y() + off.y());
        break;
    case Repeat_XY:
        p->drawTiledPixmap(r, bgp,
                            QPoint(bgpWidth - int(aligned.x() - r.x())% bgpWidth + off.x(),
                                   bgpHeight - int(aligned.y() - r.y())%bgpHeight + off.y()));
        break;
    case Repeat_None:
    default:
        p->drawPixmap(inter.x(), inter.y(), bgp, inter.x() - aligned.x() + off.x(),
                      inter.y() - aligned.y() + off.y(), bgp.width() , bgp.height());
        break;
    }


    if (background()->origin != background()->clip)
        p->restore();

    unsetClip(p);
}